

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O2

bool __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::completion_callback
          (reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *this,result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *result)

{
  pointer_type pmVar1;
  string_view name;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  url new_url;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_110;
  
  if (((((result->error).super_type.m_initialized == false) &&
       (pmVar1 = boost::
                 optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 ::operator->(&result->response),
       299 < (pmVar1->super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>)
             .result_)) &&
      (pmVar1 = boost::
                optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                ::operator->(&result->response),
      (pmVar1->super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
      result_ < bad_request)) && (this->follow_location_ == true)) {
    pmVar1 = boost::
             optional<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
             ::operator->(&result->response);
    name.len_ = 8;
    name.ptr_ = "Location";
    new_url.scheme_._0_16_ =
         boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                   ((basic_fields<std::allocator<char>_> *)pmVar1,name);
    boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
              (&location,&new_url,(allocator<char> *)&local_290);
    std::__cxx11::string::string((string *)&local_210,(string *)&location);
    url::url(&new_url,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    url::to_string_abi_cxx11_(&local_290,&new_url);
    std::__cxx11::string::string((string *)&local_230,(string *)&new_url.host_);
    update_request(this,&this->original_request_,&local_290,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string((string *)&local_250,(string *)&new_url.host_);
    url::port_str_abi_cxx11_(&local_270,&new_url);
    run(this,&local_250,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    url::~url(&new_url);
    std::__cxx11::string::~string((string *)&location);
    return false;
  }
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::result(&local_110,result);
  std::
  function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
  ::operator()(&this->completion_,&local_110);
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::~result(&local_110);
  return true;
}

Assistant:

bool completion_callback(savanna::result<http::response<http::dynamic_body>> result) override {
			if (!result.error) {
				if ((result.response->result_int() >= 300) && result.response->result_int() < 400 && follow_location_) {
					auto location = result.response->base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(original_request_, new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return false;
				}
			}
			completion_(result);
			return true;
		}